

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

uint32_t __thiscall
spirv_cross::CompilerMSL::get_declared_type_size_msl
          (CompilerMSL *this,SPIRType *type,bool is_packed,bool row_major)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  uint32_t columns;
  uint32_t uVar4;
  uint32_t uVar5;
  runtime_error *this_00;
  uint uVar6;
  uint32_t uVar7;
  uint uVar8;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if ((type->pointer == true) && (type->storage == StorageClassPhysicalStorageBuffer)) {
    uVar5 = (uint32_t)(type->array).super_VectorView<unsigned_int>.buffer_size;
    uVar7 = 0x20;
    if (type->vecsize != 3) {
      uVar7 = type->vecsize * 8;
    }
    bVar3 = type_is_pointer(this,type);
    if (0 < (int)uVar5) {
      do {
        if (bVar3 != false) {
          return uVar7;
        }
        uVar4 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type,uVar5 - 1);
        uVar7 = uVar4 * uVar7;
        type = Variant::get<spirv_cross::SPIRType>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + (type->parent_type).id);
        bVar3 = type_is_pointer(this,type);
        bVar1 = 1 < (int)uVar5;
        uVar5 = uVar5 - 1;
      } while (bVar1);
    }
  }
  else {
    uVar8 = *(uint *)&(type->super_IVariant).field_0xc;
    if ((uVar8 < 0x13) && ((0x70803U >> (uVar8 & 0x1f) & 1) != 0)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50[0] = local_40;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Querying size of opaque object.","");
      ::std::runtime_error::runtime_error(this_00,(string *)local_50);
      *(undefined ***)this_00 = &PTR__runtime_error_003d7e38;
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((type->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      if (uVar8 == 0xf) {
        uVar7 = get_declared_struct_size_msl(this,type,false,false);
        return uVar7;
      }
      uVar8 = type->vecsize;
      uVar6 = type->columns;
      if (!is_packed) {
        uVar2 = uVar6;
        if (row_major && 1 < uVar6) {
          uVar2 = uVar8;
          uVar8 = uVar6;
        }
        uVar6 = 4;
        if (uVar8 != 3) {
          uVar6 = uVar8;
        }
        return (type->width >> 3) * uVar2 * uVar6;
      }
      uVar7 = uVar6 * uVar8;
      uVar8 = type->width >> 3;
    }
    else {
      uVar5 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type);
      uVar7 = get_declared_type_array_stride_msl(this,type,is_packed,row_major);
      uVar8 = uVar5 + (uVar5 == 0);
    }
    uVar7 = uVar8 * uVar7;
  }
  return uVar7;
}

Assistant:

uint32_t CompilerMSL::get_declared_type_size_msl(const SPIRType &type, bool is_packed, bool row_major) const
{
	// Pointers take 8 bytes each
	if (type.pointer && type.storage == StorageClassPhysicalStorageBuffer)
	{
		uint32_t type_size = 8 * (type.vecsize == 3 ? 4 : type.vecsize);

		// Work our way through potentially layered arrays,
		// stopping when we hit a pointer that is not also an array.
		int32_t dim_idx = (int32_t)type.array.size() - 1;
		auto *p_type = &type;
		while (!type_is_pointer(*p_type) && dim_idx >= 0)
		{
			type_size *= to_array_size_literal(*p_type, dim_idx);
			p_type = &get<SPIRType>(p_type->parent_type);
			dim_idx--;
		}

		return type_size;
	}

	switch (type.basetype)
	{
	case SPIRType::Unknown:
	case SPIRType::Void:
	case SPIRType::AtomicCounter:
	case SPIRType::Image:
	case SPIRType::SampledImage:
	case SPIRType::Sampler:
		SPIRV_CROSS_THROW("Querying size of opaque object.");

	default:
	{
		if (!type.array.empty())
		{
			uint32_t array_size = to_array_size_literal(type);
			return get_declared_type_array_stride_msl(type, is_packed, row_major) * max(array_size, 1u);
		}

		if (type.basetype == SPIRType::Struct)
			return get_declared_struct_size_msl(type);

		if (is_packed)
		{
			return type.vecsize * type.columns * (type.width / 8);
		}
		else
		{
			// An unpacked 3-element vector or matrix column is the same memory size as a 4-element.
			uint32_t vecsize = type.vecsize;
			uint32_t columns = type.columns;

			if (row_major && columns > 1)
				swap(vecsize, columns);

			if (vecsize == 3)
				vecsize = 4;

			return vecsize * columns * (type.width / 8);
		}
	}
	}
}